

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O1

void factor(Vm *vm)

{
  Compiler *pCVar1;
  TokenType TVar2;
  CallFrame *pCVar3;
  char *pcVar4;
  size_t sVar5;
  uint32_t uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  uint8_t instruction;
  Token local_30;
  
  pCVar1 = &vm->compiler;
  TVar2 = (vm->compiler).token.type;
  if (TVar2 == TOKEN_MINUS) {
    TVar2 = (pCVar1->token).type;
    uVar8 = *(undefined4 *)&(pCVar1->token).field_0x4;
    pcVar4 = (vm->compiler).token.start;
    uVar6 = (vm->compiler).token.line;
    uVar7 = *(undefined4 *)&(vm->compiler).token.field_0x1c;
    (vm->compiler).previous.length = (vm->compiler).token.length;
    (vm->compiler).previous.line = uVar6;
    *(undefined4 *)&(vm->compiler).previous.field_0x1c = uVar7;
    (vm->compiler).previous.type = TVar2;
    *(undefined4 *)&(vm->compiler).previous.field_0x4 = uVar8;
    (vm->compiler).previous.start = pcVar4;
    uVar7 = *(undefined4 *)&(vm->compiler).next.field_0x4;
    pcVar4 = (vm->compiler).next.start;
    sVar5 = (vm->compiler).next.length;
    uVar6 = (vm->compiler).next.line;
    uVar8 = *(undefined4 *)&(vm->compiler).next.field_0x1c;
    (pCVar1->token).type = (vm->compiler).next.type;
    *(undefined4 *)&(pCVar1->token).field_0x4 = uVar7;
    (vm->compiler).token.start = pcVar4;
    (vm->compiler).token.length = sVar5;
    (vm->compiler).token.line = uVar6;
    *(undefined4 *)&(vm->compiler).token.field_0x1c = uVar8;
    scan_token(&local_30,&(vm->compiler).scanner);
    (vm->compiler).next.length = local_30.length;
    (vm->compiler).next.line = local_30.line;
    *(undefined4 *)&(vm->compiler).next.field_0x1c = local_30._28_4_;
    (vm->compiler).next.type = local_30.type;
    *(undefined4 *)&(vm->compiler).next.field_0x4 = local_30._4_4_;
    (vm->compiler).next.start = local_30.start;
    power(vm);
    pCVar3 = (vm->frames).frame_pointers[vm->frame_count - 1];
    instruction = '\x1d';
  }
  else {
    if (TVar2 != TOKEN_BANG) {
      power(vm);
      return;
    }
    TVar2 = (pCVar1->token).type;
    uVar8 = *(undefined4 *)&(pCVar1->token).field_0x4;
    pcVar4 = (vm->compiler).token.start;
    uVar6 = (vm->compiler).token.line;
    uVar7 = *(undefined4 *)&(vm->compiler).token.field_0x1c;
    (vm->compiler).previous.length = (vm->compiler).token.length;
    (vm->compiler).previous.line = uVar6;
    *(undefined4 *)&(vm->compiler).previous.field_0x1c = uVar7;
    (vm->compiler).previous.type = TVar2;
    *(undefined4 *)&(vm->compiler).previous.field_0x4 = uVar8;
    (vm->compiler).previous.start = pcVar4;
    uVar7 = *(undefined4 *)&(vm->compiler).next.field_0x4;
    pcVar4 = (vm->compiler).next.start;
    sVar5 = (vm->compiler).next.length;
    uVar6 = (vm->compiler).next.line;
    uVar8 = *(undefined4 *)&(vm->compiler).next.field_0x1c;
    (pCVar1->token).type = (vm->compiler).next.type;
    *(undefined4 *)&(pCVar1->token).field_0x4 = uVar7;
    (vm->compiler).token.start = pcVar4;
    (vm->compiler).token.length = sVar5;
    (vm->compiler).token.line = uVar6;
    *(undefined4 *)&(vm->compiler).token.field_0x1c = uVar8;
    scan_token(&local_30,&(vm->compiler).scanner);
    (vm->compiler).next.length = local_30.length;
    (vm->compiler).next.line = local_30.line;
    *(undefined4 *)&(vm->compiler).next.field_0x1c = local_30._28_4_;
    (vm->compiler).next.type = local_30.type;
    *(undefined4 *)&(vm->compiler).next.field_0x4 = local_30._4_4_;
    (vm->compiler).next.start = local_30.start;
    power(vm);
    pCVar3 = (vm->frames).frame_pointers[vm->frame_count - 1];
    instruction = '\x1e';
  }
  write_code_buffer(&pCVar3->code_buffer,instruction);
  return;
}

Assistant:

static void factor(Vm *vm) {
    switch (vm->compiler.token.type) {
        case TOKEN_BANG:
            advance(vm);
            power(vm);
            emit_no_arg(vm, OP_NOT);
            break;
        case TOKEN_MINUS:
            advance(vm);
            power(vm);
            emit_no_arg(vm, OP_NEGATE);
            break;
        default:
            power(vm);
            break;
    }
}